

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::MergeCacheTest::createInstance(MergeCacheTest *this,Context *context)

{
  Deleter<vk::Handle<(vk::HandleType)24>_> *this_00;
  Deleter<vk::VkCommandBuffer_s_*> *pDVar1;
  GraphicsCacheTestInstance *this_01;
  VkResult VVar2;
  GraphicsCacheTestInstance *this_02;
  DeviceInterface *vk;
  VkDevice device;
  DeviceInterface *pDVar3;
  VkPipelineCache sourceCaches [2];
  VkAllocationCallbacks *local_b8;
  VkAllocationCallbacks *pVStack_b0;
  size_t dataSize;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_98;
  Deleter<vk::VkCommandBuffer_s_*> *local_70;
  Deleter<vk::Handle<(vk::HandleType)24>_> *local_68;
  GraphicsCacheTestInstance *local_60;
  VkPipelineCacheCreateInfo pipelineCacheCreateInfo;
  
  this_02 = (GraphicsCacheTestInstance *)operator_new(0x5d8);
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (this_02,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  (this_02->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__MergeCacheTestInstance_00bfa220;
  local_60 = this_02 + 1;
  this_00 = &this_02[1].super_CacheTestInstance.m_cmdPool.
             super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter;
  local_70 = &this_02[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
              m_data.deleter;
  this_02[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this_02[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)0x0;
  this_02[1].super_CacheTestInstance.m_param = (CacheTestParam *)0x0;
  this_02[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .object.m_internal = 0;
  this_02[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_deviceIface = (DeviceInterface *)0x0;
  this_02[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_device = (VkDevice)0x0;
  this_02[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_02[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  object = (VkCommandBuffer_s *)0x0;
  this_02[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  deleter.m_deviceIface = (DeviceInterface *)0x0;
  this_02[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  deleter.m_device = (VkDevice)0x0;
  this_02[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  deleter.m_pool.m_internal = 0;
  this_02[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
  object.m_internal = 0;
  this_02[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
  deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_68 = this_00;
  vk = Context::getDeviceInterface((this_02->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this_02->super_CacheTestInstance).super_TestInstance.m_context);
  pipelineCacheCreateInfo.pNext = (void *)0x0;
  pipelineCacheCreateInfo.flags = 0;
  pipelineCacheCreateInfo._20_4_ = 0;
  pipelineCacheCreateInfo.initialDataSize = 0;
  pipelineCacheCreateInfo.pInitialData = (void *)0x0;
  pipelineCacheCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  pipelineCacheCreateInfo._4_4_ = 0;
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)sourceCaches,vk,device,
             &pipelineCacheCreateInfo,(VkAllocationCallbacks *)0x0);
  local_98.m_data.deleter.m_device = (VkDevice)local_b8;
  local_98.m_data.deleter.m_allocator = pVStack_b0;
  local_98.m_data.object.m_internal = sourceCaches[0].m_internal;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)sourceCaches[1].m_internal;
  sourceCaches[0].m_internal = 0;
  sourceCaches[1].m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)15>_> *)this_00);
  this_02[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_allocator = (VkAllocationCallbacks *)local_98.m_data.deleter.m_device;
  this_02[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  object = (VkCommandBuffer_s *)local_98.m_data.deleter.m_allocator;
  this_00->m_deviceIface = (DeviceInterface *)local_98.m_data.object.m_internal;
  this_02[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_device = (VkDevice)local_98.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)15>_> *)sourceCaches);
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)sourceCaches,vk,device,
             &pipelineCacheCreateInfo,(VkAllocationCallbacks *)0x0);
  pDVar1 = local_70;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_98.m_data.object.m_internal = sourceCaches[0].m_internal;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)sourceCaches[1].m_internal;
  sourceCaches[0].m_internal = 0;
  sourceCaches[1].m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)15>_> *)local_70);
  (pDVar1->m_pool).m_internal = (deUint64)local_98.m_data.deleter.m_device;
  *(VkAllocationCallbacks **)(pDVar1 + 1) = local_98.m_data.deleter.m_allocator;
  pDVar1->m_deviceIface = (DeviceInterface *)local_98.m_data.object.m_internal;
  pDVar1->m_device = (VkDevice)local_98.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)15>_> *)sourceCaches);
  dataSize = 0;
  VVar2 = (*vk->_vptr_DeviceInterface[0x2e])
                    (vk,device,
                     (this_02->super_CacheTestInstance).m_cache.
                     super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                     &dataSize,0);
  ::vk::checkResult(VVar2,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x662);
  pDVar3 = (DeviceInterface *)operator_new__(dataSize);
  this_02[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
  deleter.m_deviceIface = pDVar3;
  VVar2 = (*vk->_vptr_DeviceInterface[0x2e])
                    (vk,device,
                     (this_02->super_CacheTestInstance).m_cache.
                     super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                     &dataSize);
  ::vk::checkResult(VVar2,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x666);
  this_01 = local_60;
  pipelineCacheCreateInfo.initialDataSize = dataSize;
  pipelineCacheCreateInfo.pInitialData =
       this_02[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.
       m_data.deleter.m_deviceIface;
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)sourceCaches,vk,device,
             &pipelineCacheCreateInfo,(VkAllocationCallbacks *)0x0);
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_98.m_data.object.m_internal = sourceCaches[0].m_internal;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)sourceCaches[1].m_internal;
  sourceCaches[0].m_internal = 0;
  sourceCaches[1].m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)15>_> *)this_01);
  (this_01->super_CacheTestInstance).m_param = (CacheTestParam *)local_98.m_data.deleter.m_device;
  (this_01->super_CacheTestInstance).m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .object.m_internal = (deUint64)local_98.m_data.deleter.m_allocator;
  (this_01->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)local_98.m_data.object.m_internal;
  (this_01->super_CacheTestInstance).super_TestInstance.m_context =
       (Context *)local_98.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)15>_> *)sourceCaches);
  sourceCaches[0].m_internal = (deUint64)local_68->m_deviceIface;
  sourceCaches[1].m_internal =
       (deUint64)(this_01->super_CacheTestInstance).super_TestInstance._vptr_TestInstance;
  VVar2 = (*vk->_vptr_DeviceInterface[0x2f])(vk,device,local_70->m_deviceIface,2,sourceCaches);
  ::vk::checkResult(VVar2,"vk.mergePipelineCaches(vkDevice, *m_cacheMerged, 2u, sourceCaches)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x673);
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&dataSize,&this_02->m_renderSize);
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_98,
             (SimpleGraphicsPipelineBuilder *)&this_02->m_pipelineBuilder,
             (Vector<unsigned_int,_2> *)&dataSize,
             (VkRenderPass)
             (this_02->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkPipelineCache)
             this_02[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.deleter.m_deviceIface,
             (VkPipelineLayout)
             (this_02->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
             object.m_internal);
  pipelineCacheCreateInfo._16_8_ = local_98.m_data.deleter.m_device;
  pipelineCacheCreateInfo.initialDataSize = (deUintptr)local_98.m_data.deleter.m_allocator;
  pipelineCacheCreateInfo._0_8_ = local_98.m_data.object.m_internal;
  pipelineCacheCreateInfo.pNext = local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&this_02->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  this_02->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)pipelineCacheCreateInfo._16_8_;
  this_02->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCacheCreateInfo.initialDataSize;
  this_02->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       pipelineCacheCreateInfo._0_8_;
  this_02->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)pipelineCacheCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_98);
  return (TestInstance *)this_02;
}

Assistant:

TestInstance* MergeCacheTest::createInstance (Context& context) const
{
	return new MergeCacheTestInstance(context, &m_param);
}